

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void assemble_text(ifstream *in,ofstream *out,bool run)

{
  type avm;
  File f;
  __uniq_ptr_impl<vm::VM,_std::default_delete<vm::VM>_> local_c8;
  undefined1 local_c0 [96];
  vector<vm::Constant,_std::allocator<vm::Constant>_> local_60;
  vector<vm::Instruction,_std::allocator<vm::Instruction>_> local_48;
  vector<vm::Function,_std::allocator<vm::Function>_> local_30;
  
  File::parse_file_text((File *)(local_c0 + 8),in);
  File::output_binary((File *)(local_c0 + 8),out);
  if (run) {
    local_c0._88_4_ = local_c0._8_4_;
    std::vector<vm::Constant,_std::allocator<vm::Constant>_>::vector
              (&local_60,(vector<vm::Constant,_std::allocator<vm::Constant>_> *)(local_c0 + 0x10));
    std::vector<vm::Instruction,_std::allocator<vm::Instruction>_>::vector
              (&local_48,
               (vector<vm::Instruction,_std::allocator<vm::Instruction>_> *)(local_c0 + 0x28));
    std::vector<vm::Function,_std::allocator<vm::Function>_>::vector
              (&local_30,(vector<vm::Function,_std::allocator<vm::Function>_> *)(local_c0 + 0x40));
    vm::VM::make_vm((VM *)local_c0,(File *)(local_c0 + 0x58));
    local_c8._M_t.super__Tuple_impl<0UL,_vm::VM_*,_std::default_delete<vm::VM>_>.
    super__Head_base<0UL,_vm::VM_*,_false>._M_head_impl =
         (tuple<vm::VM_*,_std::default_delete<vm::VM>_>)
         (tuple<vm::VM_*,_std::default_delete<vm::VM>_>)local_c0._0_8_;
    local_c0._0_8_ = (__uniq_ptr_impl<vm::VM,_std::default_delete<vm::VM>_>)0x0;
    std::unique_ptr<vm::VM,_std::default_delete<vm::VM>_>::~unique_ptr
              ((unique_ptr<vm::VM,_std::default_delete<vm::VM>_> *)local_c0);
    std::vector<vm::Function,_std::allocator<vm::Function>_>::~vector(&local_30);
    if (local_48.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.
                            super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.
                            super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::vector<vm::Constant,_std::allocator<vm::Constant>_>::~vector(&local_60);
    vm::VM::start((VM *)local_c8._M_t.super__Tuple_impl<0UL,_vm::VM_*,_std::default_delete<vm::VM>_>
                        .super__Head_base<0UL,_vm::VM_*,_false>._M_head_impl);
    std::unique_ptr<vm::VM,_std::default_delete<vm::VM>_>::~unique_ptr
              ((unique_ptr<vm::VM,_std::default_delete<vm::VM>_> *)&local_c8);
  }
  std::vector<vm::Function,_std::allocator<vm::Function>_>::~vector
            ((vector<vm::Function,_std::allocator<vm::Function>_> *)(local_c0 + 0x40));
  if ((pointer)local_c0._40_8_ != (pointer)0x0) {
    operator_delete((void *)local_c0._40_8_,local_c0._56_8_ - local_c0._40_8_);
  }
  std::vector<vm::Constant,_std::allocator<vm::Constant>_>::~vector
            ((vector<vm::Constant,_std::allocator<vm::Constant>_> *)(local_c0 + 0x10));
  return;
}

Assistant:

void assemble_text(std::ifstream* in, std::ofstream* out, bool run = false) {
    try {
        File f = File::parse_file_text(*in);
        // f.output_text(std::cout);
        f.output_binary(*out);
        if (run) {
            auto avm = std::move(vm::VM::make_vm(f));
            avm->start();
        }
    }
    catch (const std::exception& e) {
        println(std::cerr, e.what());
    }
}